

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

void __thiscall PointerType::PointerType(PointerType *this,Type *type)

{
  string *psVar1;
  Type *pTVar2;
  ArrayType *this_00;
  string local_50;
  
  (this->super_Type).kind = TK_PointerType;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__PointerType_0017f8b8;
  (this->sizes)._M_dataplus._M_p = (pointer)&(this->sizes).field_2;
  (this->sizes)._M_string_length = 0;
  (this->sizes).field_2._M_local_buf[0] = '\0';
  (this->structName)._M_dataplus._M_p = (pointer)&(this->structName).field_2;
  (this->structName)._M_string_length = 0;
  (this->structName).field_2._M_local_buf[0] = '\0';
  this->levels = 1;
  this->isArrayPointer = false;
  this->isStructPointer = false;
  pTVar2 = (Type *)0x0;
  if ((type != (Type *)0x0) && (pTVar2 = (Type *)0x0, type->kind == TK_PointerType)) {
    pTVar2 = type;
  }
  psVar1 = &this->structName;
  if (pTVar2 != (Type *)0x0) {
    this->isArrayPointer = pTVar2[1].isConst;
    this->isStructPointer = *(bool *)&pTVar2[4]._vptr_Type;
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->levels = pTVar2[1].kind + TK_StructType;
    std::__cxx11::string::_M_assign((string *)&this->sizes);
  }
  this_00 = (ArrayType *)0x0;
  if ((type != (Type *)0x0) && (type->kind == TK_ArrayType)) {
    this_00 = (ArrayType *)type;
  }
  if (this_00 != (ArrayType *)0x0) {
    this->isArrayPointer = true;
    ArrayType::sizeToString_abi_cxx11_(&local_50,this_00);
    std::__cxx11::string::operator=((string *)&this->sizes,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this->isStructPointer = this_00->isStructArray;
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  pTVar2 = (Type *)0x0;
  if ((type != (Type *)0x0) && (type->kind == TK_StructType)) {
    pTVar2 = type;
  }
  if (pTVar2 != (Type *)0x0) {
    this->isStructPointer = true;
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  this->type = type;
  return;
}

Assistant:

PointerType::PointerType(Type* type): Type(TK_PointerType) {
    levels = 1;
    isArrayPointer = false;
    isStructPointer = false;

    if (auto PT = llvm::dyn_cast_or_null<PointerType>(type)) {
        isArrayPointer = PT->isArrayPointer;
        isStructPointer = PT->isStructPointer;
        structName = PT->structName;
        levels = PT->levels + 1;
        sizes = PT->sizes;
    }

    if (auto AT = llvm::dyn_cast_or_null<ArrayType>(type)) {
        isArrayPointer = true;
        sizes = AT->sizeToString();

        isStructPointer = AT->isStructArray;
        structName = AT->structName;
    }

    if (auto ST = llvm::dyn_cast_or_null<StructType>(type)) {
        isStructPointer = true;
        structName = ST->name;
    }

    this->type = type;
}